

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

uint countLeadingZeros(int x)

{
  int local_14;
  uint bits;
  int i;
  uint count;
  int x_local;
  
  bits = 0;
  local_14 = 0x20;
  for (i = x; (local_14 = local_14 + -1, local_14 != 0 && (-1 < i)); i = i << 1) {
    bits = bits + 1;
  }
  return bits;
}

Assistant:

static inline unsigned int countLeadingZeros(int x)
{
	unsigned count = 0;
	int i;
	const unsigned bits = sizeof(x) * 8;

	for (i = bits; --i; ) {
		if (x < 0) break;
		count++;
		x <<= 1;
	}

	return count;
}